

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::anon_unknown_0::LoopUnswitch::CanUnswitchLoop(LoopUnswitch *this)

{
  IRContext *pIVar1;
  CFG *pCVar2;
  mapped_type pBVar3;
  pointer pOVar4;
  uint **ppuVar5;
  bool bVar6;
  int32_t iVar7;
  mapped_type *ppBVar8;
  uint **ppuVar9;
  Instruction *pIVar10;
  DominatorTree *post_dom_tree;
  _Hash_node_base *p_Var11;
  int iVar12;
  int iVar13;
  key_type local_3c;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_38;
  
  bVar6 = true;
  if (this->switch_block_ == (BasicBlock *)0x0) {
    bVar6 = Loop::IsSafeToClone(this->loop_);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      p_Var11 = (this->loop_->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pCVar2 = (pIVar1->cfg_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                 .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
        do {
          local_3c = *(key_type *)&p_Var11[1]._M_nxt;
          ppBVar8 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&pCVar2->id2block_,&local_3c);
          pBVar3 = *ppBVar8;
          if (this->loop_->loop_latch_ == pBVar3) {
            iVar13 = 3;
          }
          else {
            pIVar10 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
            if ((pIVar10 == (Instruction *)0x0) ||
               ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
               )) {
LAB_0025c5b0:
              __assert_fail("!insts_.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                            ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
            }
            bVar6 = spvOpcodeIsBranch(((pBVar3->insts_).
                                       super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                                      previous_node_)->opcode_);
            iVar12 = 0;
            iVar13 = 0;
            if (bVar6) {
              pIVar10 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
              if ((pIVar10 == (Instruction *)0x0) ||
                 ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ !=
                  false)) goto LAB_0025c5b0;
              pIVar10 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
              iVar13 = iVar12;
              if (pIVar10->opcode_ != OpBranch) {
                bVar6 = spvOpcodeIsBranch(pIVar10->opcode_);
                if (!bVar6) {
                  __assert_fail("insn->IsBranch()",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                                ,0x225,
                                "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                               );
                }
                if (pIVar10->opcode_ == OpBranch) {
                  __assert_fail("insn->opcode() != spv::Op::OpBranch",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                                ,0x226,
                                "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                               );
                }
                pIVar1 = this->context_;
                if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar1);
                }
                pOVar4 = (pIVar10->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((pIVar10->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pOVar4) {
                  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                                ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
                }
                ppuVar5 = (uint **)(pOVar4->words).large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar9 = &(pOVar4->words).small_data_;
                if (ppuVar5 != (uint **)0x0) {
                  ppuVar9 = ppuVar5;
                }
                pIVar10 = analysis::DefUseManager::GetDef
                                    ((pIVar1->def_use_mgr_)._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                     .
                                     super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                     ._M_head_impl,**ppuVar9);
                iVar7 = spvOpcodeIsConstant(pIVar10->opcode_);
                if (((iVar7 == 0) || (iVar7 = spvOpcodeIsSpecConstant(pIVar10->opcode_), iVar7 != 0)
                    ) && (bVar6 = Loop::IsInsideLoop(this->loop_,pIVar10), !bVar6)) {
                  local_38._M_head_impl =
                       *(BasicBlock **)
                        &(((this->function_->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t;
                  post_dom_tree =
                       (DominatorTree *)
                       IRContext::GetPostDominatorAnalysis(this->context_,this->function_);
                  bVar6 = IsDynamicallyUniform(this,pIVar10,local_38._M_head_impl,post_dom_tree);
                  if (bVar6) {
                    this->switch_block_ = pBVar3;
                    iVar13 = 2;
                  }
                }
              }
            }
          }
        } while (((iVar13 == 3) || (iVar13 == 0)) &&
                (p_Var11 = p_Var11->_M_nxt, p_Var11 != (_Hash_node_base *)0x0));
      }
      bVar6 = this->switch_block_ != (BasicBlock *)0x0;
    }
  }
  return bVar6;
}

Assistant:

bool CanUnswitchLoop() {
    if (switch_block_) return true;
    if (loop_->IsSafeToClone()) return false;

    CFG& cfg = *context_->cfg();

    for (uint32_t bb_id : loop_->GetBlocks()) {
      BasicBlock* bb = cfg.block(bb_id);
      if (loop_->GetLatchBlock() == bb) {
        continue;
      }

      if (bb->terminator()->IsBranch() &&
          bb->terminator()->opcode() != spv::Op::OpBranch) {
        if (IsConditionNonConstantLoopInvariant(bb->terminator())) {
          switch_block_ = bb;
          break;
        }
      }
    }

    return switch_block_;
  }